

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::GenerateLoadPolymorphicInlineCacheSlot
               (Instr *instrLdSt,RegOpnd *opndInlineCache,RegOpnd *opndType,
               uint polymorphicInlineCacheSize)

{
  RegOpnd *indexOpnd;
  Instr *pIVar1;
  IntConstOpnd *pIVar2;
  IndirOpnd *src1Opnd;
  
  indexOpnd = IR::RegOpnd::New(TyUint64,instrLdSt->m_func);
  pIVar1 = IR::Instr::New(MOV,&indexOpnd->super_Opnd,&opndType->super_Opnd,instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar1);
  pIVar2 = IR::IntConstOpnd::New(1,TyUint8,instrLdSt->m_func,true);
  pIVar1 = IR::Instr::New(SHR,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar2->super_Opnd,
                          instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar1);
  pIVar2 = IR::IntConstOpnd::New
                     ((ulong)(polymorphicInlineCacheSize - 1) << 5,TyInt64,instrLdSt->m_func,true);
  pIVar1 = IR::Instr::New(AND,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar2->super_Opnd,
                          instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar1);
  src1Opnd = IR::IndirOpnd::New(opndInlineCache,indexOpnd,TyUint64,instrLdSt->m_func);
  pIVar1 = IR::Instr::New(LEA,&opndInlineCache->super_Opnd,&src1Opnd->super_Opnd,instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar1);
  return;
}

Assistant:

void
LowererMD::GenerateLoadPolymorphicInlineCacheSlot(IR::Instr * instrLdSt, IR::RegOpnd * opndInlineCache, IR::RegOpnd * opndType, uint polymorphicInlineCacheSize)
{
    // Generate
    //
    // MOV r1, type
    // SHR r1, PolymorphicInlineCacheShift
    // AND r1, (size - 1)
    // SHL r1, log2(sizeof(Js::InlineCache))
    // LEA inlineCache, [inlineCache + r1]

    // MOV r1, type
    IR::RegOpnd * opndOffset = IR::RegOpnd::New(TyMachPtr, instrLdSt->m_func);
    IR::Instr * instr = IR::Instr::New(Js::OpCode::MOV, opndOffset, opndType, instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);

    IntConstType rightShiftAmount = PolymorphicInlineCacheShift;
    IntConstType leftShiftAmount = Math::Log2(sizeof(Js::InlineCache));
    // instead of generating
    // SHR r1, PolymorphicInlineCacheShift
    // AND r1, (size - 1)
    // SHL r1, log2(sizeof(Js::InlineCache))
    //
    // we can generate:
    // SHR r1, (PolymorphicInlineCacheShift - log2(sizeof(Js::InlineCache))
    // AND r1, (size - 1) << log2(sizeof(Js::InlineCache))
    Assert(rightShiftAmount > leftShiftAmount);
    instr = IR::Instr::New(Js::OpCode::SHR, opndOffset, opndOffset, IR::IntConstOpnd::New(rightShiftAmount - leftShiftAmount, TyUint8, instrLdSt->m_func, true), instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);
    instr = IR::Instr::New(Js::OpCode::AND, opndOffset, opndOffset, IR::IntConstOpnd::New(((__int64)(polymorphicInlineCacheSize - 1) << leftShiftAmount), TyMachReg, instrLdSt->m_func, true), instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);

    // LEA inlineCache, [inlineCache + r1]
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(opndInlineCache, opndOffset, TyMachPtr, instrLdSt->m_func);
    instr = IR::Instr::New(Js::OpCode::LEA, opndInlineCache, indirOpnd, instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);
}